

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

void ritobin::io::json_impl::json_value_impl<ritobin::File,_(ritobin::Category)4>::to_json
               (File *value,json *json)

{
  json *json_local;
  File *value_local;
  
  hash_to_json<ritobin::XXH64>(&value->value,json);
  return;
}

Assistant:

static void to_json(T const& value, json& json) noexcept {
            hash_to_json(value.value, json);
        }